

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleTypeHandler.cpp
# Opt level: O0

BigPropertyIndex __thiscall
Js::SimpleTypeHandler<6UL>::GetPropertyIndex_EnumerateTTD
          (SimpleTypeHandler<6UL> *this,PropertyRecord *pRecord)

{
  PropertyId propertyId;
  BOOL BVar1;
  ushort local_1a;
  PropertyRecord *pPStack_18;
  PropertyIndex index;
  PropertyRecord *pRecord_local;
  SimpleTypeHandler<6UL> *this_local;
  
  pPStack_18 = pRecord;
  pRecord_local = (PropertyRecord *)this;
  propertyId = PropertyRecord::GetPropertyId(pRecord);
  BVar1 = GetDescriptor(this,propertyId,&local_1a);
  if (BVar1 == 0) {
    TTDAbort_unrecoverable_error("We found this during enum so what is going on here?");
  }
  if ((this->descriptors[local_1a].field_1.Attributes & 8) != 0) {
    TTDAbort_unrecoverable_error("How is this deleted but we enumerated it anyway???");
  }
  return (BigPropertyIndex)local_1a;
}

Assistant:

Js::BigPropertyIndex SimpleTypeHandler<size>::GetPropertyIndex_EnumerateTTD(const Js::PropertyRecord* pRecord)
    {
        PropertyIndex index;
        if(this->GetDescriptor(pRecord->GetPropertyId(), &index))
        {
            TTDAssert(!(this->descriptors[index].Attributes & PropertyDeleted), "How is this deleted but we enumerated it anyway???");

            return (Js::BigPropertyIndex)index;
        }

        TTDAssert(false, "We found this during enum so what is going on here?");
        return Js::Constants::NoBigSlot;
    }